

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_GetVirtualCoords(GPU_Target *target,float *x,float *y,float displayX,float displayY)

{
  float displayY_local;
  float displayX_local;
  float *y_local;
  float *x_local;
  GPU_Target *target_local;
  
  if ((target != (GPU_Target *)0x0) && (_gpu_current_renderer != (GPU_Renderer *)0x0)) {
    if (target->context == (GPU_Context *)0x0) {
      if (target->image == (GPU_Image *)0x0) {
        if (x != (float *)0x0) {
          *x = displayX;
        }
        if (y != (float *)0x0) {
          *y = displayY;
        }
      }
      else {
        if (x != (float *)0x0) {
          *x = (displayX * (float)target->w) / (float)target->image->w;
        }
        if (y != (float *)0x0) {
          *y = (displayY * (float)target->h) / (float)target->image->h;
        }
      }
    }
    else {
      if (x != (float *)0x0) {
        *x = (displayX * (float)target->w) / (float)target->context->window_w;
      }
      if (y != (float *)0x0) {
        *y = (displayY * (float)target->h) / (float)target->context->window_h;
      }
    }
    if ((_gpu_current_renderer->coordinate_mode & 1U) != 0) {
      *y = (float)target->h - *y;
    }
  }
  return;
}

Assistant:

void GPU_GetVirtualCoords(GPU_Target* target, float* x, float* y, float displayX, float displayY)
{
    if(target == NULL || _gpu_current_renderer == NULL)
        return;

    // Scale from raw window/image coords to the virtual scale
    if(target->context != NULL)
    {
        if(x != NULL)
            *x = (displayX*target->w)/target->context->window_w;
        if(y != NULL)
            *y = (displayY*target->h)/target->context->window_h;
    }
    else if(target->image != NULL)
    {
        if(x != NULL)
            *x = (displayX*target->w)/target->image->w;
        if(y != NULL)
            *y = (displayY*target->h)/target->image->h;
    }
    else
    {
        // What is the backing for this target?!
        if(x != NULL)
            *x = displayX;
        if(y != NULL)
            *y = displayY;
    }
    
    // Invert coordinates to math coords
    if(_gpu_current_renderer->coordinate_mode)
        *y = target->h - *y;
}